

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmepoll.c
# Opt level: O0

void wake_server_thread(select_data_ptr sd)

{
  ssize_t sVar1;
  long in_RDI;
  
  if ((*(int *)(in_RDI + 0x40) != -1) &&
     (sVar1 = write(*(int *)(in_RDI + 0x40),&wake_server_thread::buffer,1), sVar1 != 1)) {
    printf("Whoops, wake write failed\n");
  }
  return;
}

Assistant:

static void
wake_server_thread(select_data_ptr sd)
{
    static char buffer = 'W';  /* doesn't matter what we write */
    if (sd->wake_write_fd != -1) {
#ifdef HAVE_WINDOWS_H
	send(sd->wake_write_fd, &buffer, 1, 0);
#else
	if (write(sd->wake_write_fd, &buffer, 1) != 1) {
	    printf("Whoops, wake write failed\n");
	}
#endif
    }
}